

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void compress(uint64_t *state,uint8_t *buf)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  uint64_t uVar21;
  ulong uVar22;
  ulong auStack_338 [9];
  long local_2f0 [5];
  ulong local_2c8 [83];
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  uVar5 = state[4];
  uVar6 = state[5];
  uVar7 = state[6];
  uVar8 = state[7];
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    uVar10 = *(ulong *)(buf + lVar9 * 8);
    local_2c8[lVar9 + 2] =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
  }
  for (lVar9 = 0x10; lVar9 != 0x50; lVar9 = lVar9 + 1) {
    uVar10 = auStack_338[lVar9 + 1];
    uVar15 = local_2c8[lVar9];
    local_2c8[lVar9 + 2] =
         local_2f0[lVar9] + auStack_338[lVar9] +
         (uVar10 >> 7 ^
         (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
         (uVar15 >> 6 ^ (uVar15 << 3 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  }
  uVar10 = uVar8;
  uVar15 = uVar7;
  uVar11 = uVar1;
  uVar12 = uVar4;
  uVar14 = uVar5;
  uVar19 = uVar6;
  uVar17 = uVar2;
  uVar21 = uVar3;
  for (uVar22 = 0; uVar22 < 0x50; uVar22 = uVar22 + 8) {
    lVar9 = uVar10 + ((uVar15 ^ uVar19) & uVar14 ^ uVar15) +
            ((uVar14 << 0x17 | uVar14 >> 0x29) ^
            (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe)) +
            round_key[uVar22] + local_2c8[uVar22 + 2];
    uVar12 = uVar12 + lVar9;
    uVar10 = (uVar17 & uVar11 | (uVar17 | uVar11) & uVar21) +
             ((uVar11 << 0x19 | uVar11 >> 0x27) ^
             (uVar11 << 0x1e | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar9;
    lVar9 = uVar15 + round_key[uVar22 + 1] + local_2c8[uVar22 + 3] +
            ((uVar19 ^ uVar14) & uVar12 ^ uVar19) +
            ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
            (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
    uVar20 = uVar21 + lVar9;
    uVar15 = (uVar10 & uVar11 | (uVar10 | uVar11) & uVar17) +
             ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
             (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar9;
    lVar9 = uVar19 + round_key[uVar22 + 2] + local_2c8[uVar22 + 4] +
            ((uVar12 ^ uVar14) & uVar20 ^ uVar14) +
            ((uVar20 * 0x800000 | uVar20 >> 0x29) ^
            (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe));
    uVar16 = uVar17 + lVar9;
    uVar18 = (uVar15 & uVar10 | (uVar15 | uVar10) & uVar11) +
             ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
             (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar9;
    lVar9 = uVar14 + round_key[uVar22 + 3] + local_2c8[uVar22 + 5] +
            ((uVar20 ^ uVar12) & uVar16 ^ uVar12) +
            ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
            (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
    uVar11 = uVar11 + lVar9;
    uVar13 = (uVar18 & uVar15 | (uVar18 | uVar15) & uVar10) +
             ((uVar18 * 0x2000000 | uVar18 >> 0x27) ^
             (uVar18 * 0x40000000 | uVar18 >> 0x22) ^ (uVar18 << 0x24 | uVar18 >> 0x1c)) + lVar9;
    lVar9 = uVar12 + round_key[uVar22 + 4] + local_2c8[uVar22 + 6] +
            ((uVar16 ^ uVar20) & uVar11 ^ uVar20) +
            ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
            (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    uVar10 = uVar10 + lVar9;
    uVar12 = lVar9 + (uVar13 & uVar18 | (uVar13 | uVar18) & uVar15) +
                     ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
                     (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c));
    lVar9 = uVar20 + round_key[uVar22 + 5] + local_2c8[uVar22 + 7] +
            ((uVar11 ^ uVar16) & uVar10 ^ uVar16) +
            ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
            (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar15 = uVar15 + lVar9;
    uVar21 = lVar9 + (uVar12 & uVar13 | (uVar12 | uVar13) & uVar18) +
                     ((uVar12 * 0x2000000 | uVar12 >> 0x27) ^
                     (uVar12 * 0x40000000 | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c));
    lVar9 = local_2c8[uVar22 + 8] + round_key[uVar22 + 6] + uVar16 +
            ((uVar10 ^ uVar11) & uVar15 ^ uVar11) +
            ((uVar15 * 0x800000 | uVar15 >> 0x29) ^
            (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe));
    uVar19 = uVar18 + lVar9;
    uVar17 = (uVar21 & uVar12 | (uVar21 | uVar12) & uVar13) +
             ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
             (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c)) + lVar9;
    lVar9 = local_2c8[uVar22 + 9] + round_key[uVar22 + 7] + uVar11 +
            ((uVar15 ^ uVar10) & uVar19 ^ uVar10) +
            ((uVar19 * 0x800000 | uVar19 >> 0x29) ^
            (uVar19 << 0x2e | uVar19 >> 0x12) ^ (uVar19 << 0x32 | uVar19 >> 0xe));
    uVar14 = uVar13 + lVar9;
    uVar11 = (uVar17 & uVar21 | (uVar17 | uVar21) & uVar12) +
             ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
             (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar9;
  }
  *state = uVar11 + uVar1;
  state[1] = uVar17 + uVar2;
  state[2] = uVar21 + uVar3;
  state[3] = uVar12 + uVar4;
  state[4] = uVar14 + uVar5;
  state[5] = uVar19 + uVar6;
  state[6] = uVar15 + uVar7;
  state[7] = uVar10 + uVar8;
  return;
}

Assistant:

static void
compress(uint64_t state[8], const uint8_t buf[SHA512_BLOCK_SIZE])
{
	uint64_t W[80], t;
	uint64_t a, b, c, d, e, f, g, h;
	int i;

	a = state[0];
	b = state[1];
	c = state[2];
	d = state[3];
	e = state[4];
	f = state[5];
	g = state[6];
	h = state[7];

	for (i = 0; i < 16; i++)
		W[i] = load_be64(buf+8*i);

	for (i = 16; i < 80; i++)
		W[i] = W[i-16] + G0(W[i-15]) + W[i-7] + G1(W[i-2]);

	for (i = 0; i < 80; i += 8) {
		ROUND(i+0, a,b,c,d,e,f,g,h);
		ROUND(i+1, h,a,b,c,d,e,f,g);
		ROUND(i+2, g,h,a,b,c,d,e,f);
		ROUND(i+3, f,g,h,a,b,c,d,e);
		ROUND(i+4, e,f,g,h,a,b,c,d);
		ROUND(i+5, d,e,f,g,h,a,b,c);
		ROUND(i+6, c,d,e,f,g,h,a,b);
		ROUND(i+7, b,c,d,e,f,g,h,a);
	}

	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
	state[5] += f;
	state[6] += g;
	state[7] += h;
}